

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::SetIsThreadBound(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HANDLE hSourceProcessHandle;
  HANDLE hSourceHandle;
  HANDLE hTargetProcessHandle;
  void *pvVar4;
  Recycler *this_local;
  
  if (this->mainThreadHandle != (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x234,"(mainThreadHandle == nullptr)","mainThreadHandle == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  hSourceProcessHandle = GetCurrentProcess();
  hSourceHandle = PAL_GetCurrentThread();
  hTargetProcessHandle = GetCurrentProcess();
  DuplicateHandle(hSourceProcessHandle,hSourceHandle,hTargetProcessHandle,&this->mainThreadHandle,0,
                  0,2);
  pvVar4 = GetStackBase();
  this->stackBase = pvVar4;
  return;
}

Assistant:

void
Recycler::SetIsThreadBound()
{
    Assert(mainThreadHandle == nullptr);
    ::DuplicateHandle(::GetCurrentProcess(), ::GetCurrentThread(), ::GetCurrentProcess(),  &mainThreadHandle,
        0, FALSE, DUPLICATE_SAME_ACCESS);

    stackBase = GetStackBase();
}